

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satProof.c
# Opt level: O2

void * Proof_DeriveCore(Vec_Set_t *vProof,int hRoot)

{
  Vec_Int_t *vUsed;
  Vec_Int_t *pVVar1;
  int in_EDX;
  int hRoot_local;
  Vec_Int_t Roots;
  
  Roots.pArray = &hRoot_local;
  Roots.nCap = 1;
  Roots.nSize = 1;
  if (hRoot == -1) {
    pVVar1 = (Vec_Int_t *)0x0;
  }
  else {
    hRoot_local = hRoot;
    vUsed = Proof_CollectUsedIter(vProof,&Roots,in_EDX);
    pVVar1 = Sat_ProofCollectCore(vProof,vUsed);
    Vec_IntFree(vUsed);
    qsort(pVVar1->pArray,(long)pVVar1->nSize,4,Vec_IntSortCompare2);
  }
  return pVVar1;
}

Assistant:

void * Proof_DeriveCore( Vec_Set_t * vProof, int hRoot )
{
    Vec_Int_t Roots = { 1, 1, &hRoot }, * vRoots = &Roots;
    Vec_Int_t * vCore, * vUsed;
    if ( hRoot == -1 )
        return NULL;
    // collect visited clauses
    vUsed = Proof_CollectUsedIter( vProof, vRoots, 0 );
    // collect core clauses 
    vCore = Sat_ProofCollectCore( vProof, vUsed );
    Vec_IntFree( vUsed );
    Vec_IntSort( vCore, 1 );
    return vCore;
}